

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O2

void __thiscall
clunk::Node::GetSliderCaptures(Node *this,Color color,MoveType type,uint64_t mvs,int from)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint to;
  
  if (this->checks != 0) {
    __assert_fail("!checks",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6b2,
                  "void clunk::Node::GetSliderCaptures(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6b3,
                  "void clunk::Node::GetSliderCaptures(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  pbVar2 = (byte *)(&_board)[(uint)from];
  if (pbVar2 == _EMPTY) {
    __assert_fail("_board[from] != _EMPTY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6b4,
                  "void clunk::Node::GetSliderCaptures(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  if ((color | type) == (uint)*pbVar2) {
    if ((uint)pbVar2[1] != from) {
      __assert_fail("_board[from]->sqr == from",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x6b6,
                    "void clunk::Node::GetSliderCaptures(const Color, const MoveType, uint64_t, const int)"
                   );
    }
    iVar3 = GetPinDir(this,color,from);
    do {
      if (mvs == 0) {
        return;
      }
      if ((mvs & 0xff) != 0) {
        to = (int)(mvs & 0xff) - 1;
        iVar4 = Direction(from,to);
        if ((0x22 < iVar4 + 0x11U) || ((0x700050007U >> ((ulong)(iVar4 + 0x11U) & 0x3f) & 1) == 0))
        {
          __assert_fail("IS_DIR(dir)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x6bd,
                        "void clunk::Node::GetSliderCaptures(const Color, const MoveType, uint64_t, const int)"
                       );
        }
        iVar5 = -iVar4;
        if (0 < iVar4) {
          iVar5 = iVar4;
        }
        if ((iVar3 == 0) || (iVar5 == iVar3)) {
          bVar1 = *(byte *)(&_board)[to];
          if ((bVar1 == 0) && ((byte *)(&_board)[to] != _EMPTY)) {
            __assert_fail("cap || (_board[to] == _EMPTY)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x6c0,
                          "void clunk::Node::GetSliderCaptures(const Color, const MoveType, uint64_t, const int)"
                         );
          }
          if ((~(bVar1 ^ color) & 1) == 0 && bVar1 != 0) {
            iVar4 = ValueOf((uint)bVar1);
            iVar5 = Distance(from,to);
            AddMove(this,type,from,to,iVar4 - (iVar5 + type * 8),(uint)bVar1,0);
          }
        }
      }
      mvs = mvs >> 8;
    } while( true );
  }
  __assert_fail("_board[from]->type == (color|type)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                ,0x6b5,
                "void clunk::Node::GetSliderCaptures(const Color, const MoveType, uint64_t, const int)"
               );
}

Assistant:

void GetSliderCaptures(const Color color, const MoveType type,
                         uint64_t mvs, const int from)
  {
    assert(!checks);
    assert(IS_SQUARE(from));
    assert(_board[from] != _EMPTY);
    assert(_board[from]->type == (color|type));
    assert(_board[from]->sqr == from);
    const int pinDir = GetPinDir(color, from);
    int score;
    while (mvs) {
      if (mvs & 0xFF) {
        const int to = ((mvs & 0xFF) - 1);
        const int dir = (Direction(from, to));
        assert(IS_DIR(dir));
        if (!pinDir || (abs(dir) == pinDir)) {
          const int cap = _board[to]->type;
          assert(cap || (_board[to] == _EMPTY));
          if ((cap != 0) & (COLOR(cap) != color)) {
            score = (ValueOf(cap) - Distance(from, to) - (8 * type));
            AddMove(type, from, to, score, cap);
          }
        }
      }
      mvs >>= 8;
    }
  }